

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O0

void __thiscall hittable_list::add(hittable_list *this,shared_ptr<hittable> *object)

{
  element_type *peVar1;
  aabb local_78;
  aabb local_48;
  shared_ptr<hittable> *local_18;
  shared_ptr<hittable> *object_local;
  hittable_list *this_local;
  
  local_18 = object;
  object_local = (shared_ptr<hittable> *)this;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (&this->objects,object);
  peVar1 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      object);
  (*peVar1->_vptr_hittable[3])(&local_78);
  aabb::aabb(&local_48,&this->bbox,&local_78);
  memcpy(&this->bbox,&local_48,0x30);
  return;
}

Assistant:

void add(shared_ptr<hittable> object) {
        objects.push_back(object);
        bbox = aabb(bbox, object->bounding_box());
    }